

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# csp_if_eth.c
# Opt level: O0

int csp_eth_tx(csp_iface_t *iface,uint16_t via,csp_packet_t *packet,int from_me)

{
  ushort csp_addr;
  ushort uVar1;
  __uint16_t _Var2;
  int iVar3;
  undefined4 in_ECX;
  csp_packet_t *in_RDX;
  uint16_t *in_RDI;
  uint16_t seg_size;
  uint16_t seg_size_max;
  csp_eth_header_t *eth_frame;
  uint16_t offset;
  csp_eth_interface_data_t *ifdata;
  undefined4 in_stack_ffffffffffffffb8;
  uint8_t *in_stack_ffffffffffffffc0;
  ushort local_32;
  void *pxTaskWoken;
  undefined4 in_stack_ffffffffffffffd8;
  
  pxTaskWoken = *(void **)(in_RDI + 8);
  if ((in_RDX->id).dst == *in_RDI) {
    csp_qfifo_write(in_RDX,(csp_iface_t *)CONCAT44(in_ECX,in_stack_ffffffffffffffd8),pxTaskWoken);
  }
  else {
    csp_id_prepend((csp_packet_t *)0x114597);
    csp_eth_tx::packet_id = csp_eth_tx::packet_id + 1;
    for (local_32 = 0; local_32 < in_RDX->frame_length; local_32 = local_32 + uVar1) {
      in_stack_ffffffffffffffc0 = *(uint8_t **)((long)pxTaskWoken + 0x70);
      csp_addr = *(short *)((long)pxTaskWoken + 0x62) - 0x16;
      uVar1 = in_RDX->frame_length - local_32;
      if (csp_addr < uVar1) {
        uVar1 = csp_addr;
      }
      _Var2 = __bswap_16(0x88b5);
      *(__uint16_t *)(in_stack_ffffffffffffffc0 + 0xc) = _Var2;
      csp_eth_arp_get_addr(in_stack_ffffffffffffffc0,csp_addr);
      *(undefined4 *)(in_stack_ffffffffffffffc0 + 6) = *(undefined4 *)((long)pxTaskWoken + 0x80);
      *(undefined2 *)(in_stack_ffffffffffffffc0 + 10) = *(undefined2 *)((long)pxTaskWoken + 0x84);
      csp_eth_pack_header((csp_eth_header_t *)
                          CONCAT26(csp_addr,CONCAT24(uVar1,in_stack_ffffffffffffffb8)),0,0,0x11,
                          0x468c);
      memcpy(in_stack_ffffffffffffffc0 + 0x16,in_RDX->frame_begin + (int)(uint)local_32,(ulong)uVar1
            );
      iVar3 = (**(code **)((long)pxTaskWoken + 0x68))
                        (*(undefined8 *)(in_RDI + 0xc),in_stack_ffffffffffffffc0);
      if (iVar3 != 0) {
        *(int *)(in_RDI + 0x1a) = *(int *)(in_RDI + 0x1a) + 1;
        return -0xb;
      }
      if ((eth_debug & 1U) != 0) {
        csp_hex_dump((char *)in_stack_ffffffffffffffc0,
                     (void *)CONCAT26(csp_addr,CONCAT24(uVar1,in_stack_ffffffffffffffb8)),0);
      }
    }
    csp_buffer_free(in_stack_ffffffffffffffc0);
  }
  return 0;
}

Assistant:

int csp_eth_tx(csp_iface_t * iface, uint16_t via, csp_packet_t * packet, int from_me) {

	csp_eth_interface_data_t * ifdata = iface->interface_data;

    /* Loopback */
    if (packet->id.dst == iface->addr) {
        csp_qfifo_write(packet, iface, NULL);
        return CSP_ERR_NONE;
    }

    csp_id_prepend(packet);

    static uint16_t packet_id = 0;
    packet_id++;
    uint16_t offset = 0;

    while (offset < packet->frame_length) {

        csp_eth_header_t *eth_frame = ifdata->tx_buf;

        const uint16_t seg_size_max = ifdata->tx_mtu - sizeof(csp_eth_header_t);
        uint16_t seg_size = packet->frame_length - offset;
        if (seg_size > seg_size_max) {
            seg_size = seg_size_max;
        }

        eth_frame->ether_type = htobe16(CSP_ETH_TYPE_CSP);
        csp_eth_arp_get_addr(eth_frame->ether_dhost, packet->id.dst);
        memcpy(eth_frame->ether_shost, ifdata->if_mac, CSP_ETH_ALEN);

        csp_eth_pack_header(eth_frame, packet_id, packet->id.src, seg_size, packet->frame_length);

        memcpy(eth_frame->frame_begin, packet->frame_begin + offset, seg_size);

		if ((ifdata->tx_func)(iface->driver_data, eth_frame) != CSP_ERR_NONE) {
			iface->tx_error++;
			/* Does not free on return */
			return CSP_ERR_DRIVER;
        }

        if (eth_debug) csp_hex_dump("tx", eth_frame, sizeof(csp_eth_header_t) + offset + seg_size);

        offset += seg_size;
    }

    csp_buffer_free(packet);
    return CSP_ERR_NONE;
}